

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.h
# Opt level: O0

u32 __thiscall HighsMatrixColoring::color(HighsMatrixColoring *this,double value)

{
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  unsigned_long *in_RDI;
  double in_XMM0_Qa;
  iterator it;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar4;
  const_iterator in_stack_ffffffffffffffc8;
  _Self local_28;
  double local_20;
  _Self local_18;
  double local_10;
  
  local_20 = in_XMM0_Qa - (double)in_RDI[6];
  local_10 = in_XMM0_Qa;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
       ::lower_bound(in_stack_ffffffffffffffa8,(key_type *)0x6dd314);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
       ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator==(&local_18,&local_28);
  uVar4 = true;
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_double,_unsigned_int>_> *)0x6dd34e);
    uVar4 = local_10 + (double)in_RDI[6] < ppVar2->first;
  }
  if ((bool)uVar4 != false) {
    std::_Rb_tree_const_iterator<std::pair<const_double,_unsigned_int>_>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_double,_unsigned_int>_> *)
               &stack0xffffffffffffffc8,&local_18);
    sVar3 = std::
            map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
            ::size((map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                    *)0x6dd393);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<double,unsigned_int,std::less<double>,std::allocator<std::pair<double_const,unsigned_int>>>
         ::emplace_hint<double&,unsigned_long>
                   ((map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                     *)(sVar3 + 1),in_stack_ffffffffffffffc8,
                    (double *)CONCAT17(uVar4,in_stack_ffffffffffffffb8),in_RDI);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_int>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_double,_unsigned_int>_> *)0x6dd3ce);
  return ppVar2->second;
}

Assistant:

u32 color(double value) {
    // iterator points to smallest element in map which fulfills key >= value -
    // tolerance
    auto it = colorMap.lower_bound(value - tolerance);
    // check if there is no such element, or if this element has a key value +
    // tolerance in which case we create a new color and store it with the key
    // value
    if (it == colorMap.end() || it->first > value + tolerance)
      it = colorMap.emplace_hint(it, value, colorMap.size() + 1);
    return it->second;
  }